

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O0

int __thiscall CMDPACTION::GetIndofMostLikelyOutcome(CMDPACTION *this)

{
  float fVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDI;
  int oind;
  int mlind;
  double HighestProb;
  undefined4 local_18;
  undefined4 local_14;
  
  fVar1 = 0.0;
  local_14 = -1;
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
    if ((int)sVar2 <= local_18) break;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x38),(long)local_18);
    if (fVar1 <= *pvVar3) {
      local_14 = local_18;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x38),(long)local_18);
      fVar1 = *pvVar3;
    }
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int CMDPACTION::GetIndofMostLikelyOutcome()
{
    double HighestProb = 0;
    int mlind = -1;

    for (int oind = 0; oind < (int)this->SuccsID.size(); oind++) {
        if (this->SuccsProb[oind] >= HighestProb) {
            mlind = oind;
            HighestProb = this->SuccsProb[oind];
        }
    }

    return mlind;
}